

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

uint64_t swap8(uint64_t n,int doit)

{
  ulong uVar1;
  
  uVar1 = n >> 0x38 | (n & 0xff000000000000) >> 0x28 | (n & 0xff0000000000) >> 0x18 |
          (n & 0xff00000000) >> 8 | (n & 0xff000000) << 8 | (n & 0xff0000) << 0x18 |
          (n & 0xff00) << 0x28 | n << 0x38;
  if (doit == 0) {
    uVar1 = n;
  }
  return uVar1;
}

Assistant:

uint64_t swap8(uint64_t n, int doit)
{
    if (doit)
        return (((n >> 56) & 0x00000000000000ffULL) |
                ((n >> 40) & 0x000000000000ff00ULL) |
                ((n >> 24) & 0x0000000000ff0000ULL) |
                ((n >>  8) & 0x00000000ff000000ULL) |
                ((n <<  8) & 0x000000ff00000000ULL) |
                ((n << 24) & 0x0000ff0000000000ULL) |
                ((n << 40) & 0x00ff000000000000ULL) |
                ((n << 56) & 0xff00000000000000ULL));
    return n;
}